

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O2

void Gia_Truth6ToGiaTest(Gia_Man_t *p)

{
  ulong uVar1;
  Vec_Int_t *p_00;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Gia_Obj_t *pGVar5;
  word wVar6;
  uint v;
  uint uVar7;
  long lVar8;
  int Id;
  int local_58;
  uint local_54;
  word local_50;
  int pVarLits [6];
  
  p_01 = Vec_IntStartFull(p->vCis->nSize);
  p_02 = Vec_IntStart(100);
  local_58 = p->vCos->nSize;
  Gia_ManHashAlloc(p);
  uVar7 = 0;
  for (v = 0; (int)v < p->vCos->nSize; v = v + 1) {
    pGVar5 = Gia_ManCo(p,v);
    Id = Gia_ObjId(p,pGVar5);
    if (Id == 0) break;
    Gia_ManCollectCis(p,&Id,1,p_02);
    iVar2 = p_02->nSize;
    if ((iVar2 < 6) && ((int)v < local_58)) {
      for (lVar8 = 0; lVar8 < iVar2; lVar8 = lVar8 + 1) {
        iVar2 = Vec_IntEntry(p_02,(int)lVar8);
        pGVar5 = Gia_ManObj(p,iVar2);
        iVar3 = Gia_ObjCioId(pGVar5);
        Vec_IntWriteEntry(p_01,iVar3,(int)lVar8);
        if (iVar2 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        pVarLits[lVar8] = iVar2 * 2;
        iVar2 = p_02->nSize;
      }
      wVar6 = Gia_LutComputeTruth6Map(p,v,p_01);
      iVar2 = Gia_Truth5ToGia(p,pVarLits,p_02->nSize,(uint)wVar6,1);
      if ((iVar2 < 0) || (iVar3 = Abc_Lit2Var(iVar2), p->nObjs <= iVar3)) {
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      local_54 = uVar7;
      local_50 = wVar6;
      iVar3 = Abc_Lit2Var(iVar2);
      pGVar5 = Gia_ManObj(p,iVar3);
      if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && (int)*(uint *)pGVar5 < 0) {
        __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      pGVar5 = Gia_ManAppendObj(p);
      pGVar5->field_0x3 = pGVar5->field_0x3 | 0x80;
      iVar3 = Gia_ObjId(p,pGVar5);
      iVar4 = Abc_Lit2Var(iVar2);
      *(ulong *)pGVar5 = *(ulong *)pGVar5 & 0xffffffffe0000000 | (ulong)(iVar3 - iVar4 & 0x1fffffff)
      ;
      iVar2 = Abc_LitIsCompl(iVar2);
      uVar1 = *(ulong *)pGVar5;
      *(ulong *)pGVar5 = uVar1 & 0xffffffffdfffffff | (ulong)(uint)(iVar2 << 0x1d);
      *(ulong *)pGVar5 =
           uVar1 & 0xe0000000dfffffff | (ulong)(uint)(iVar2 << 0x1d) |
           (ulong)(p->vCos->nSize & 0x1fffffff) << 0x20;
      p_00 = p->vCos;
      iVar2 = Gia_ObjId(p,pGVar5);
      Vec_IntPush(p_00,iVar2);
      if (p->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p,pGVar5 + -(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff),pGVar5);
      }
      Gia_ObjId(p,pGVar5);
      wVar6 = Gia_LutComputeTruth6Map(p,p->vCos->nSize + -1,p_01);
      uVar7 = local_54;
      for (iVar2 = 0; iVar2 < p_02->nSize; iVar2 = iVar2 + 1) {
        iVar3 = Vec_IntEntry(p_02,iVar2);
        pGVar5 = Gia_ManObj(p,iVar3);
        iVar3 = Gia_ObjCioId(pGVar5);
        Vec_IntWriteEntry(p_01,iVar3,-1);
      }
      if (local_50 != wVar6) {
        printf("Error for output %d.\n",(ulong)v);
      }
      uVar7 = uVar7 + 1;
    }
  }
  Gia_ManHashStop(p);
  printf("Finished processing %d outputs.\n",(ulong)uVar7);
  Vec_IntFree(p_02);
  Vec_IntFree(p_01);
  return;
}

Assistant:

void Gia_Truth6ToGiaTest( Gia_Man_t * p )
{
    int Size = 5;
    word Truth, TruthNew;
    Vec_Int_t * vMap = Vec_IntStartFull( Gia_ManCiNum(p) );
    Vec_Int_t * vSupp = Vec_IntStart( 100 );
    int nCos = Gia_ManCoNum(p), Count = 0;
    int i, k, Id, ObjId, iLitNew;
    Gia_ManHashAlloc( p );
    Gia_ManForEachCoId( p, Id, i )
    {
        Gia_ManCollectCis( p, &Id, 1, vSupp ); // ObjIds
        if ( Vec_IntSize(vSupp) <= Size && i < nCos )
        {
            int pVarLits[6];
            Vec_IntForEachEntry( vSupp, ObjId, k )
            {
                int CioId = Gia_ObjCioId(Gia_ManObj(p, ObjId));
                Vec_IntWriteEntry( vMap, CioId, k );
                pVarLits[k] = Abc_Var2Lit( ObjId, 0 );
            }
            Truth = Gia_LutComputeTruth6Map( p, i, vMap );
            if ( Size == 5 )
                iLitNew = Gia_Truth5ToGia( p, pVarLits, Vec_IntSize(vSupp), (unsigned)Truth, 1 );
            else
                iLitNew = Gia_Truth6ToGia( p, pVarLits, Vec_IntSize(vSupp), Truth, 1 );
            Gia_ManAppendCo( p, iLitNew );
            TruthNew = Gia_LutComputeTruth6Map( p, Gia_ManCoNum(p)-1, vMap );
            Vec_IntForEachEntry( vSupp, ObjId, k )
            {
                int CioId = Gia_ObjCioId(Gia_ManObj(p, ObjId));
                Vec_IntWriteEntry( vMap, CioId, -1 );
            }
            if ( Truth != TruthNew )
                printf( "Error for output %d.\n", i );
            Count++;
            //Dau_DsdPrintFromTruth( &Truth, Vec_IntSize(vSupp) );
        }
    }
    Gia_ManHashStop( p );
    printf( "Finished processing %d outputs.\n", Count );
    Vec_IntFree( vSupp );
    Vec_IntFree( vMap );
}